

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::RepeatedStringFieldGenerator::GenerateInlineAccessorDefinitions
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::std::string& $classname$::$name$(int index) const {\n  return $name$_.$cppget$(index);\n}\ninline ::std::string* $classname$::mutable_$name$(int index) {\n  return $name$_.Mutable(index);\n}\ninline void $classname$::set_$name$(int index, const ::std::string& value) {\n  $name$_.Mutable(index)->assign(value);\n}\ninline void $classname$::set_$name$(int index, const char* value) {\n  $name$_.Mutable(index)->assign(value);\n}\ninline void $classname$::set_$name$(int index, const $pointer_type$* value, size_t size) {\n  $name$_.Mutable(index)->assign(\n    reinterpret_cast<const char*>(value), size);\n}\ninline ::std::string* $classname$::add_$name$() {\n  return $name$_.Add();\n}\ninline void $classname$::add_$name$(const ::std::string& value) {\n  $name$_.Add()->assign(value);\n}\ninline void $classname$::add_$name$(const char* value) {\n  $name$_.Add()->assign(value);\n}\ninline void $classname$::add_$name$(const $pointer_type$* value, size_t size) {\n  $name$_.Add()->assign(reinterpret_cast<const char*>(value), size);\n}\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedPtrField< ::std::string>&\n$classname$::$name$() const {\n  return $name$_;\n}\ninline ::google::protobuf::RepeatedPtrField< ::std::string>*\n$classname$::mutable_$name$() {\n  return &$name$_;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const ::std::string& $classname$::$name$(int index) const {\n"
    "  return $name$_.$cppget$(index);\n"
    "}\n"
    "inline ::std::string* $classname$::mutable_$name$(int index) {\n"
    "  return $name$_.Mutable(index);\n"
    "}\n"
    "inline void $classname$::set_$name$(int index, const ::std::string& value) {\n"
    "  $name$_.Mutable(index)->assign(value);\n"
    "}\n"
    "inline void $classname$::set_$name$(int index, const char* value) {\n"
    "  $name$_.Mutable(index)->assign(value);\n"
    "}\n"
    "inline void "
    "$classname$::set_$name$"
    "(int index, const $pointer_type$* value, size_t size) {\n"
    "  $name$_.Mutable(index)->assign(\n"
    "    reinterpret_cast<const char*>(value), size);\n"
    "}\n"
    "inline ::std::string* $classname$::add_$name$() {\n"
    "  return $name$_.Add();\n"
    "}\n"
    "inline void $classname$::add_$name$(const ::std::string& value) {\n"
    "  $name$_.Add()->assign(value);\n"
    "}\n"
    "inline void $classname$::add_$name$(const char* value) {\n"
    "  $name$_.Add()->assign(value);\n"
    "}\n"
    "inline void "
    "$classname$::add_$name$(const $pointer_type$* value, size_t size) {\n"
    "  $name$_.Add()->assign(reinterpret_cast<const char*>(value), size);\n"
    "}\n");
  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedPtrField< ::std::string>&\n"
    "$classname$::$name$() const {\n"
    "  return $name$_;\n"
    "}\n"
    "inline ::google::protobuf::RepeatedPtrField< ::std::string>*\n"
    "$classname$::mutable_$name$() {\n"
    "  return &$name$_;\n"
    "}\n");
}